

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O3

void mpc_sbox_verify_s256_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,word256 mask_a,
               word256 mask_b,word256 mask_c)

{
  bool bVar1;
  bool bVar2;
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  long lVar5;
  undefined1 (*pauVar6) [32];
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  pauVar7 = &local_100;
  pauVar4 = &local_140;
  lVar5 = 0;
  pauVar3 = &local_1c0;
  pauVar6 = &local_180;
  pauVar8 = &local_220;
  pauVar9 = &local_1e0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    auVar10 = *(undefined1 (*) [32])in[lVar5].w64;
    auVar14 = vpand_avx2(auVar10,in_ZMM0._0_32_);
    auVar15 = vpsllq_avx2(auVar14,2);
    auVar14 = vpsrlq_avx2(auVar14,0x3e);
    auVar14 = vpermq_avx2(auVar14,0x93);
    auVar14 = vpor_avx2(auVar14,auVar15);
    *pauVar3 = auVar14;
    auVar14 = vpand_avx2(auVar10,in_ZMM1._0_32_);
    auVar13 = in_ZMM2._0_32_;
    auVar15 = vpand_avx2(auVar10,auVar13);
    auVar10 = vpaddq_avx2(auVar14,auVar14);
    auVar14 = vpsrlq_avx2(auVar14,0x3f);
    *pauVar8 = auVar15;
    auVar14 = vpermq_avx2(auVar14,0x93);
    auVar10 = vpor_avx2(auVar14,auVar10);
    *pauVar9 = auVar10;
    auVar10 = *(undefined1 (*) [32])rvec->s[lVar5].w64;
    lVar5 = 1;
    auVar14 = vpand_avx2(auVar10,in_ZMM0._0_32_);
    auVar15 = vpsllq_avx2(auVar14,2);
    auVar14 = vpsrlq_avx2(auVar14,0x3e);
    auVar14 = vpermq_avx2(auVar14,0x93);
    auVar14 = vpor_avx2(auVar14,auVar15);
    *pauVar7 = auVar14;
    auVar14 = vpand_avx2(auVar10,in_ZMM1._0_32_);
    auVar15 = vpand_avx2(auVar10,auVar13);
    pauVar7 = &local_120;
    auVar10 = vpaddq_avx2(auVar14,auVar14);
    auVar14 = vpsrlq_avx2(auVar14,0x3f);
    *pauVar6 = auVar15;
    auVar14 = vpermq_avx2(auVar14,0x93);
    auVar10 = vpor_avx2(auVar14,auVar10);
    *pauVar4 = auVar10;
    pauVar4 = &local_160;
    pauVar3 = &local_260;
    pauVar6 = &local_1a0;
    pauVar8 = &local_240;
    pauVar9 = &local_200;
    bVar1 = false;
  } while (bVar2);
  pauVar7 = &local_1c0;
  lVar5 = 0;
  auVar10 = vpternlogq_avx512vl(local_1a0 ^ local_180,local_1c0 ^ local_260,local_1e0,0x78);
  local_80[0] = vpternlogq_avx512vl(auVar10,local_200,local_1c0,0x78);
  auVar14 = vpternlogq_avx512vl(local_200,local_220,local_1e0,0x48);
  auVar10 = vpand_avx2(local_240,local_1c0);
  auVar14 = vpternlogq_avx512vl(local_160,auVar14,local_140,0x96);
  auVar11 = vpternlogq_avx512vl(auVar10,local_220,local_1c0 ^ local_260,0x78);
  auVar10 = *(undefined1 (*) [32])view->s[1].w64;
  local_180 = vpternlogq_avx512vl(auVar14,local_240,local_1e0,0x78);
  auVar16 = vpsllq_avx2(local_180,0x3f);
  auVar12 = vpsrlq_avx2(local_180,1);
  auVar15 = vpsrlq_avx2(auVar10,0x3f);
  auVar14 = vpaddq_avx2(auVar10,auVar10);
  local_a0 = vpand_avx2(auVar10,auVar13);
  auVar15 = vpermq_avx2(auVar15,0x93);
  auVar16 = vpermq_avx2(auVar16,0x39);
  local_1a0 = vpternlogq_avx512vl(auVar15,auVar13,auVar14,200);
  auVar14 = vpor_avx2(auVar16,auVar12);
  local_c0 = vpternlogq_avx512vl(auVar11,local_120,local_100,0x96);
  auVar16 = vpsrlq_avx2(local_c0,2);
  auVar15 = vpsllq_avx2(local_c0,0x3e);
  auVar15 = vpermq_avx2(auVar15,0x39);
  auVar15 = vpor_avx2(auVar15,auVar16);
  auVar14 = vpternlogq_avx512vl(auVar15,local_80[0],auVar14,0x96);
  auVar15 = vpsrlq_avx2(auVar10,0x3e);
  *(undefined1 (*) [32])view->s[0].w64 = auVar14;
  auVar14 = vpsllq_avx2(auVar10,2);
  auVar10 = vpermq_avx2(auVar15,0x93);
  local_e0 = vpternlogq_avx512vl(auVar10,auVar13,auVar14,200);
  pauVar4 = &local_220;
  pauVar3 = &local_c0;
  pauVar6 = &local_1e0;
  pauVar8 = &local_180;
  pauVar9 = local_80;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    auVar10 = *pauVar7 ^ *pauVar8;
    auVar13 = *pauVar7 ^ *pauVar6;
    auVar15 = auVar13 ^ *pauVar3;
    auVar13 = auVar13 ^ *pauVar9;
    *pauVar8 = auVar10;
    auVar14 = vpsrlq_avx2(auVar10,2);
    auVar10 = vpsllq_avx2(auVar10,0x3e);
    auVar10 = vpermq_avx2(auVar10,0x39);
    *pauVar3 = auVar15;
    *pauVar9 = auVar13;
    auVar14 = vpor_avx2(auVar10,auVar14);
    auVar16 = vpsrlq_avx2(auVar15,1);
    auVar15 = vpsllq_avx2(auVar15,0x3f);
    *pauVar7 = auVar14;
    auVar10 = *pauVar4;
    auVar15 = vpermq_avx2(auVar15,0x39);
    pauVar7 = &local_260;
    auVar15 = vpor_avx2(auVar15,auVar16);
    *pauVar6 = auVar15;
    auVar10 = vpternlogq_avx512vl(auVar14 ^ auVar10,auVar15,auVar13,0x96);
    *(undefined1 (*) [32])out[lVar5].w64 = auVar10;
    lVar5 = 1;
    pauVar4 = &local_240;
    pauVar3 = &local_e0;
    pauVar6 = &local_200;
    pauVar8 = &local_1a0;
    pauVar9 = &local_a0;
    bVar1 = false;
  } while (bVar2);
  return;
}

Assistant:

ATTR_TARGET_AVX2
static void mpc_sbox_verify_s256_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                     const rvec_t* rvec, const word256 mask_a, const word256 mask_b,
                                     const word256 mask_c) {
  bitsliced_mm256_step_1(SC_VERIFY, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm256_and_verify_def(r0m, x0s, x1s, r2m, mask_c, 0);
  // b & c
  mpc_mm256_and_verify_def(r2m, x1s, x2m, r1s, mask_c, 1);
  // c & a
  mpc_mm256_and_verify_def(r1m, x0s, x2m, r0s, mask_c, 2);

  bitsliced_mm256_step_2(SC_VERIFY);
}